

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DUI.h
# Opt level: O2

_Bool DUI_Button(char *text)

{
  size_t sVar1;
  byte bVar2;
  SDL_Point SVar3;
  SDL_Rect bounds;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  
  sVar1 = strlen(text);
  bVar2 = _duiClicked;
  local_20 = (int)sVar1 * _duiStyle.CharSize + _duiStyle.ButtonPadding * 2;
  local_1c = _duiStyle.CharSize + _duiStyle.ButtonPadding * 2;
  local_28 = _duiCursor.x;
  local_24 = _duiCursor.y;
  if (((_duiMouse.x < _duiCursor.x) || (_duiCursor.x + local_20 <= _duiMouse.x)) ||
     (local_1c + _duiCursor.y <= _duiMouse.y || _duiMouse.y < _duiCursor.y)) {
    DUI_setColorDefault();
    bVar2 = 0;
  }
  else {
    DUI_setColorHover();
  }
  SDL_RenderFillRect(_duiRenderer,&local_28);
  DUI_setColorBorder();
  SDL_RenderDrawRect(_duiRenderer,&local_28);
  SVar3.x = _duiStyle.ButtonPadding + _duiCursor.x;
  SVar3.y = _duiStyle.ButtonPadding + _duiCursor.y;
  _duiCursor = SVar3;
  DUI_Print("%s",text);
  _duiCursor.y = local_24;
  _duiCursor.x = local_20 + local_28 + _duiStyle.ButtonMargin;
  return (_Bool)(bVar2 & 1);
}

Assistant:

bool DUI_Button(const char * text)
{
    int width = (strlen(text) * _duiStyle.CharSize) 
        + (_duiStyle.ButtonPadding * 2);

    int height = _duiStyle.CharSize 
        + (_duiStyle.ButtonPadding * 2);

    SDL_Rect bounds = {
        .x = _duiCursor.x,
        .y = _duiCursor.y,
        .w = width,
        .h = height,
    };

    bool hover = SDL_PointInRect(&_duiMouse, &bounds);
    bool clicked = (hover && _duiClicked);

    if (hover) {
        DUI_setColorHover();
    }
    else {
        DUI_setColorDefault();
    }

    SDL_RenderFillRect(_duiRenderer, &bounds);

    DUI_setColorBorder();
    SDL_RenderDrawRect(_duiRenderer, &bounds);

    _duiCursor.x += _duiStyle.ButtonPadding;
    _duiCursor.y += _duiStyle.ButtonPadding;

    DUI_Print("%s", text);

    _duiCursor.x = bounds.x + bounds.w + _duiStyle.ButtonMargin;
    _duiCursor.y = bounds.y;

    return clicked;
}